

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O2

int xmlBufSetInputBaseCur(xmlBufPtr buf,xmlParserInputPtr input,size_t base,size_t cur)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  long lStack_8;
  
  if (input != (xmlParserInputPtr)0x0) {
    if ((buf == (xmlBufPtr)0x0) || (buf->error != 0)) {
      pxVar5 = "";
      input->end = "";
      input->cur = "";
      iVar1 = -1;
      lStack_8 = 0x18;
    }
    else {
      uVar2 = (ulong)buf->compat_size;
      if ((uVar2 < 0x7fffffff) && (buf->size != uVar2)) {
        buf->size = uVar2;
      }
      uVar3 = (ulong)buf->compat_use;
      uVar2 = buf->use;
      if (buf->use != uVar3 && uVar3 < 0x7fffffff) {
        buf->use = uVar3;
        uVar2 = uVar3;
      }
      pxVar5 = buf->content;
      pxVar4 = pxVar5 + base;
      input->base = pxVar4;
      input->cur = pxVar4 + cur;
      pxVar5 = pxVar5 + uVar2;
      iVar1 = 0;
      lStack_8 = 0x28;
    }
    *(xmlChar **)((long)&input->buf + lStack_8) = pxVar5;
    return iVar1;
  }
  return -1;
}

Assistant:

int
xmlBufSetInputBaseCur(xmlBufPtr buf, xmlParserInputPtr input,
                      size_t base, size_t cur) {
    if (input == NULL)
        return(-1);
    if ((buf == NULL) || (buf->error)) {
        input->base = input->cur = input->end = BAD_CAST "";
        return(-1);
    }
    CHECK_COMPAT(buf)
    input->base = &buf->content[base];
    input->cur = input->base + cur;
    input->end = &buf->content[buf->use];
    return(0);
}